

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_MuxRestructure2(Gia_Man_t *pNew,Str_Ntk_t *pNtk,int iMux,int nMuxes,Vec_Int_t *vDelay,
                       int nLutSize,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int fChanges;
  int Delay2;
  int Delay;
  Str_Mux_t pTree [10000];
  int Limit;
  int nLutSize_local;
  Vec_Int_t *vDelay_local;
  int nMuxes_local;
  int iMux_local;
  Str_Ntk_t *pNtk_local;
  Gia_Man_t *pNew_local;
  
  bVar1 = false;
  if (nMuxes < 10000) {
    if (9999 < nMuxes) {
      __assert_fail("nMuxes < Limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x6a9,
                    "int Str_MuxRestructure2(Gia_Man_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int, int)"
                   );
    }
    Str_MuxCreate((Str_Mux_t *)&Delay2,pNtk,iMux,nMuxes,vDelay,nLutSize);
    iVar2 = Str_MuxDelayEdge_rec((Str_Mux_t *)&Delay2,0);
    while( true ) {
      iVar3 = Str_MuxRestruct_rec(pNew,pNtk,(Str_Mux_t *)&Delay2,(Str_Mux_t *)&Delay2,0,vDelay,
                                  fVerbose);
      if (iVar3 == 0) break;
      bVar1 = true;
    }
    if (bVar1) {
      iVar3 = Str_MuxDelayEdge_rec((Str_Mux_t *)&Delay2,0);
      pNtk->DelayGain = (iVar2 - iVar3) + pNtk->DelayGain;
      pNew_local._4_4_ = Str_MuxToGia_rec(pNew,(Str_Mux_t *)&Delay2,0,vDelay);
    }
    else {
      pNew_local._4_4_ = -1;
    }
  }
  else {
    pNew_local._4_4_ = -1;
  }
  return pNew_local._4_4_;
}

Assistant:

int Str_MuxRestructure2( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fVerbose )
{
    int Limit = MAX_TREE;
    Str_Mux_t pTree[MAX_TREE];
    int Delay, Delay2, fChanges = 0;
    if ( nMuxes >= Limit )
        return -1;
    assert( nMuxes < Limit );
    Str_MuxCreate( pTree, pNtk, iMux, nMuxes, vDelay, nLutSize );
    Delay = Str_MuxDelayEdge_rec( pTree, 0 );
    while ( 1 )
    {     
        if ( !Str_MuxRestruct_rec(pNew, pNtk, pTree, pTree, 0, vDelay, fVerbose) )
            break;
        fChanges = 1;
    }
    if ( !fChanges )
        return -1;
    Delay2 = Str_MuxDelayEdge_rec( pTree, 0 );
//    printf( "Improved delay for tree %d with %d MUXes (%d -> %d).\n", iMux, nMuxes, Delay, Delay2 );
    pNtk->DelayGain += Delay - Delay2;
    return Str_MuxToGia_rec( pNew, pTree, 0, vDelay );
}